

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::HasSubstrMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
          (HasSubstrMatcher<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  long lVar1;
  string local_40 [32];
  MatchResultListener *local_20;
  MatchResultListener *param_2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = param_2;
  param_2_local = (MatchResultListener *)s;
  s_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::__cxx11::string::string(local_40,(string *)s);
  lVar1 = std::__cxx11::string::find(local_40,(ulong)this);
  std::__cxx11::string::~string(local_40);
  return lVar1 != -1;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    return StringType(s).find(substring_) != StringType::npos;
  }